

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_> * __thiscall
pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
def<void(kratos::Stmt::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool)>
          (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *this,char *name_,
          offset_in_Var_to_subr *f)

{
  offset_in_Var_to_subr f_00;
  name *extra;
  is_method local_58;
  sibling local_50;
  object local_48;
  cpp_function local_40;
  cpp_function cf;
  
  f_00 = *f;
  extra = (name *)f[1];
  local_50.value.m_ptr = *(handle *)this;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58.class_.m_ptr = (handle)(handle)name_;
  cf.super_function.super_object.super_handle.m_ptr = (function)PyObject_GetAttrString();
  if ((handle)cf.super_function.super_object.super_handle.m_ptr == (handle)0x0) {
    PyErr_Clear();
    cf.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  cpp_function::
  cpp_function<void,kratos::Stmt,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_40,f_00,extra,&local_58,&local_50);
  object::~object((object *)&cf);
  object::~object(&local_48);
  detail::add_class_method((object *)this,name_,&local_40);
  object::~object((object *)&local_40);
  return (class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }